

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<void,_void_()>::reject<QString>
          (PromiseDataBase<void,_void_()> *this,QString *error)

{
  PromiseError local_20;
  QString *local_18;
  QString *error_local;
  PromiseDataBase<void,_void_()> *this_local;
  
  local_18 = error;
  error_local = (QString *)this;
  PromiseError::PromiseError<QString>(&local_20,error);
  PromiseError::operator=(&this->m_error,&local_20);
  PromiseError::~PromiseError(&local_20);
  setSettled(this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }